

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rng.c
# Opt level: O2

bool_t rngTestFIPS1(octet *buf)

{
  size_t sVar1;
  size_t sVar2;
  long lVar3;
  
  sVar1 = u32Weight(*(u32 *)(buf + 0x9c0));
  for (lVar3 = 0x137; lVar3 != -1; lVar3 = lVar3 + -1) {
    sVar2 = u64Weight(*(u64 *)(buf + lVar3 * 8));
    sVar1 = sVar1 + sVar2;
  }
  return (bool_t)(sVar1 - 0x25fe < 0x225);
}

Assistant:

bool_t rngTestFIPS1(const octet buf[2500])
{
	size_t s = 0;
	size_t count = W_OF_O(2500);
	ASSERT(memIsValid(buf, 2500));
	if (O_OF_W(count) > 2500)
	{
		ASSERT(B_PER_W == 64);
		s = u32Weight(*(const u32*)(buf + 2496));
		--count;
	}
	while (count--)
		s += wordWeight(((const word*)buf)[count]);
	return 9725 < s && s < 10275;
}